

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O1

Rhs * __thiscall
Lib::
SkipList<Inferences::ALASCA::Demodulation::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::LDComparator>
::pop(Rhs *__return_storage_ptr__,
     SkipList<Inferences::ALASCA::Demodulation::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::LDComparator>
     *this)

{
  uint uVar1;
  Node *pNVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  Clause *pCVar5;
  undefined7 uVar6;
  uint uVar7;
  uint uVar8;
  Node *pNVar9;
  ulong uVar10;
  
  pNVar2 = this->_left->nodes[0];
  uVar1 = this->_top;
  uVar7 = 1;
  uVar8 = uVar7;
  if (1 < uVar1) {
    pNVar9 = this->_left + 1;
    do {
      uVar8 = uVar7;
      if ((Node *)(pNVar9->value).term.super_TermList._content != pNVar2) break;
      uVar7 = uVar7 + 1;
      pNVar9 = (Node *)&(pNVar9->value).term._sort;
      uVar8 = uVar1;
    } while (uVar1 != uVar7);
  }
  uVar10 = 0;
  do {
    this->_left->nodes[uVar10] = pNVar2->nodes[uVar10];
    uVar10 = uVar10 + 1;
  } while (uVar8 != uVar10);
  uVar3 = (pNVar2->value).term.super_TermList._content;
  uVar4 = (pNVar2->value).term._sort._content;
  uVar6 = *(undefined7 *)&(pNVar2->value).field_0x11;
  pCVar5 = (pNVar2->value).clause;
  __return_storage_ptr__->ordOptimization = (pNVar2->value).ordOptimization;
  *(undefined7 *)&__return_storage_ptr__->field_0x11 = uVar6;
  __return_storage_ptr__->clause = pCVar5;
  (__return_storage_ptr__->term).super_TermList._content = uVar3;
  (__return_storage_ptr__->term)._sort._content = uVar4;
  if (pNVar2 != (Node *)0x0) {
    uVar10 = (ulong)(uVar8 - 1) * 8 + 0x37 & 0xfffffffffffffff0;
    if (uVar10 == 0) {
      (pNVar2->value).term.super_TermList._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pNVar2;
    }
    else if (uVar10 < 0x11) {
      (pNVar2->value).term.super_TermList._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pNVar2;
    }
    else if (uVar10 < 0x19) {
      (pNVar2->value).term.super_TermList._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pNVar2;
    }
    else if (uVar10 < 0x21) {
      (pNVar2->value).term.super_TermList._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pNVar2;
    }
    else if (uVar10 < 0x31) {
      (pNVar2->value).term.super_TermList._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pNVar2;
    }
    else if (uVar10 < 0x41) {
      (pNVar2->value).term.super_TermList._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pNVar2;
    }
    else {
      operator_delete(pNVar2,0x10);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Value pop()
  {
    ASS(isNonEmpty());

    // find the height of the first
    Node* node = _left->nodes[0];
    unsigned h;
    for (h = 1;h < _top;h++) {
      if (_left->nodes[h] != node) {
	break;
      }
    }
    // the height of the first node is h-1
    for (unsigned i = 0;i < h;i++) {
      _left->nodes[i] = node->nodes[i];
    }
    Value val = node->value;
    deallocate(node,h-1);
    return val;
  }